

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmaes.cpp
# Opt level: O0

pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
Cmaes::eig(pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           *__return_storage_ptr__,Cmaes *this,MatrixXd *A,MatrixXd *B)

{
  Index *this_00;
  EigenvectorsType *other;
  RealVectorType *other_00;
  undefined1 local_a0 [8];
  VectorXd D;
  undefined1 local_80 [8];
  MatrixXd V;
  GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> solver;
  MatrixXd *B_local;
  MatrixXd *A_local;
  Cmaes *this_local;
  
  this_00 = &V.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  Eigen::GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::
  GeneralizedSelfAdjointEigenSolver
            ((GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00
             ,A,B,0x180);
  other = Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvectors
                    ((SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_80,other);
  other_00 = Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvalues
                       ((SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                        &V.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_a0,other_00);
  std::make_pair<Eigen::Matrix<double,_1,_1,0,_1,_1>&,Eigen::Matrix<double,_1,1,0,_1,1>&>
            (__return_storage_ptr__,(Matrix<double,__1,__1,_0,__1,__1> *)local_80,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_a0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_a0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_80);
  Eigen::GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::
  ~GeneralizedSelfAdjointEigenSolver
            ((GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &V.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  return __return_storage_ptr__;
}

Assistant:

std::pair<MatrixXd, VectorXd> Cmaes::eig(const MatrixXd& A, const MatrixXd& B)
{
	Eigen::GeneralizedSelfAdjointEigenSolver<MatrixXd> solver(A, B);
	MatrixXd V = solver.eigenvectors();
	VectorXd D = solver.eigenvalues();

	return std::make_pair(V, D);
}